

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

Function * __thiscall
wasm::anon_unknown_225::FunctionSplitter::copyFunction
          (FunctionSplitter *this,Function *func,string *prefix)

{
  long *plVar1;
  Module *func_00;
  undefined8 *puVar2;
  Function *pFVar3;
  pointer pcVar4;
  char *pcVar5;
  string_view sVar6;
  Name NVar7;
  Name newName;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  pointer *local_90;
  long local_88;
  pointer local_80 [2];
  long *local_70;
  IString *local_68;
  long local_60;
  undefined8 uStack_58;
  size_type *local_50;
  __string_type __str;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 "byn-split-",prefix);
  std::__cxx11::string::operator=((string *)prefix,(string *)local_b8._M_pod_data);
  if ((code **)local_b8._M_unused._0_8_ != &local_a8) {
    operator_delete(local_b8._M_unused._M_object,(ulong)(local_a8 + 1));
  }
  func_00 = this->module;
  local_50 = &__str._M_string_length;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_50,(ulong)__str._M_dataplus._M_p,0,'\x01');
  pcVar5 = (func->super_Importable).super_Named.name.super_IString.str._M_str;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,pcVar5,
             pcVar5 + (func->super_Importable).super_Named.name.super_IString.str._M_len);
  pcVar4 = (pointer)0xf;
  if (local_50 != &__str._M_string_length) {
    pcVar4 = (pointer)__str._M_string_length;
  }
  if (pcVar4 < __str._M_dataplus._M_p + local_88) {
    pcVar4 = (pointer)0xf;
    if (local_90 != local_80) {
      pcVar4 = local_80[0];
    }
    if (__str._M_dataplus._M_p + local_88 <= pcVar4) {
      puVar2 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_50);
      pcVar5 = __str._M_dataplus._M_p;
      goto LAB_0074aab1;
    }
  }
  puVar2 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_90);
  pcVar5 = __str._M_dataplus._M_p;
LAB_0074aab1:
  local_70 = &local_60;
  plVar1 = puVar2 + 2;
  if ((long *)*puVar2 == plVar1) {
    local_60 = *plVar1;
    uStack_58 = puVar2[3];
  }
  else {
    local_60 = *plVar1;
    local_70 = (long *)*puVar2;
  }
  local_68 = (IString *)puVar2[1];
  *puVar2 = plVar1;
  puVar2[1] = 0;
  *(undefined1 *)plVar1 = 0;
  sVar6._M_str = (char *)0x0;
  sVar6._M_len = (size_t)local_70;
  sVar6 = IString::interned(local_68,sVar6,SUB81(plVar1,0));
  local_b8._8_8_ = 0;
  pcStack_a0 = std::
               _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
               ::_M_invoke;
  local_a8 = std::
             _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
             ::_M_manager;
  NVar7.super_IString.str._M_str = (char *)&local_b8;
  NVar7.super_IString.str._M_len = (size_t)sVar6._M_str;
  local_b8._M_unused._M_object = func_00;
  NVar7 = Names::getValidName((Names *)sVar6._M_len,NVar7,(function<bool_(wasm::Name)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,3);
  }
  newName.super_IString.str._M_str = pcVar5;
  newName.super_IString.str._M_len = (size_t)NVar7.super_IString.str._M_str;
  pFVar3 = wasm::ModuleUtils::copyFunction
                     ((ModuleUtils *)func,(Function *)func_00,NVar7.super_IString.str._M_len,newName
                     );
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,(ulong)(local_80[0] + 1));
  }
  if (local_50 != &__str._M_string_length) {
    operator_delete(local_50,__str._M_string_length + 1);
  }
  return pFVar3;
}

Assistant:

Function* copyFunction(Function* func, std::string prefix) {
    // TODO: We copy quite a lot more than we need here, and throw stuff out.
    //       It is simple to just copy the entire thing to get the params and
    //       results and all that, but we could be more efficient.
    prefix = "byn-split-" + prefix;
    return ModuleUtils::copyFunction(
      func,
      *module,
      Names::getValidFunctionName(*module,
                                  prefix + '$' + func->name.toString()));
  }